

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strisdigit_s.c
# Opt level: O2

_Bool strisdigit_s(char *dest,rsize_t dmax)

{
  long lVar1;
  rsize_t rVar2;
  errno_t error;
  _Bool _Var3;
  char *msg;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    msg = "strisdigit_s: dest is null";
    error = 400;
  }
  else if (dmax == 0) {
    msg = "strisdigit_s: dmax is 0";
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      if (*dest == '\0') {
LAB_00105619:
        _Var3 = false;
      }
      else {
        for (rVar2 = 0; (_Var3 = true, dmax != rVar2 && (dest[rVar2] != '\0')); rVar2 = rVar2 + 1) {
          if ((byte)(dest[rVar2] - 0x3aU) < 0xf6) goto LAB_00105619;
        }
      }
      goto LAB_001055df;
    }
    msg = "strisdigit_s: dmax exceeds max";
    error = 0x193;
  }
  _Var3 = false;
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_001055df:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return _Var3;
  }
  __stack_chk_fail();
}

Assistant:

bool
strisdigit_s (const char *dest, rsize_t dmax)
{
    if (!dest) {
        invoke_safe_str_constraint_handler("strisdigit_s: dest is null",
                   NULL, ESNULLP);
        return (false);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strisdigit_s: dmax is 0",
                   NULL, ESZEROL);
        return (false);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strisdigit_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (false);
    }

    if (*dest == '\0') {
        return (false);
    }

    while (dmax && *dest) {

        if ((*dest < '0') || (*dest > '9')) {
            return (false);
        }
        dest++;
        dmax--;
    }

    return (true);
}